

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline(Convolution_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  _func_int **pp_Var3;
  int *piVar4;
  undefined8 uVar5;
  _func_int *p_Var6;
  void *pvVar7;
  long *plVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  bool bVar14;
  bool bVar15;
  byte bVar16;
  uint num_input;
  int iVar17;
  int iVar18;
  uint uVar19;
  Layer *pLVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  int k_7;
  uint uVar30;
  _func_int **pp_Var31;
  long lVar32;
  undefined4 *puVar33;
  int k;
  int iVar34;
  ulong uVar35;
  _func_int *p_Var36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  void *pvVar54;
  void *pvVar55;
  undefined4 *puVar56;
  byte bVar57;
  int k_6;
  int iVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  int k_1;
  long lVar62;
  ulong uVar63;
  int iVar64;
  _func_int **pp_Var65;
  long lVar66;
  long lVar67;
  undefined4 *puVar68;
  int iVar69;
  long lVar70;
  long lVar71;
  int iVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  ulong uVar77;
  long lVar78;
  uint uVar79;
  _func_int **pp_Var80;
  _func_int **pp_Var81;
  undefined1 (*pauVar82) [16];
  long lVar83;
  int iVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  ulong local_398;
  undefined4 *local_390;
  long local_380;
  long local_378;
  long local_370;
  ulong local_368;
  long local_360;
  long local_330;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2c0;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_250;
  undefined1 local_248 [32];
  ulong local_228;
  long local_220;
  ParamDict pd_6;
  ParamDict pd;
  size_t local_1e8;
  Allocator *local_1d8;
  int iStack_1d0;
  int iStack_1cc;
  undefined8 uStack_1c8;
  int aiStack_1c0 [2];
  size_t local_1b8;
  void *local_1b0;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 uStack_1a0;
  undefined4 uStack_198;
  long *local_190;
  undefined1 local_188 [16];
  undefined4 local_178;
  undefined8 local_170;
  long local_160;
  ulong local_158;
  ulong local_150;
  long local_148;
  int local_13c;
  _func_int *local_138;
  long local_130;
  long local_128;
  ulong local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  ParamDict pd_5;
  ulong local_a0;
  ModelBinFromMatArray local_40;
  
  p_Var36 = this->_vptr_Convolution_x86_avx512[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var36) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var36)) {
  case 1:
    pLVar20 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar20->_vptr_Layer[2])(pLVar20,&pd);
    break;
  case 2:
    pLVar20 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var36));
    (*pLVar20->_vptr_Layer[2])(pLVar20,&pd);
    goto LAB_001cf07d;
  case 3:
    pLVar20 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var36));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var36) + 4));
    (*pLVar20->_vptr_Layer[2])(pLVar20,&pd);
    goto LAB_001cf07d;
  case 4:
    pLVar20 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar20->_vptr_Layer[2])(pLVar20,&pd);
    break;
  case 5:
    pLVar20 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar20->_vptr_Layer[2])(pLVar20,&pd);
    break;
  case 6:
    pLVar20 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var36));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var36) + 4));
    (*pLVar20->_vptr_Layer[2])(pLVar20,&pd);
LAB_001cf07d:
    ParamDict::~ParamDict(&pd);
    goto LAB_001cf097;
  default:
    pLVar20 = (Layer *)0x0;
    goto LAB_001cf097;
  }
  ParamDict::~ParamDict(&pd);
LAB_001cf097:
  if (pLVar20 != (Layer *)0x0) {
    (*pLVar20->_vptr_Layer[4])(pLVar20,opt);
  }
  this->activation = pLVar20;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c +
               (long)this->_vptr_Convolution_x86_avx512[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  p_Var36 = this->_vptr_Convolution_x86_avx512[-3];
  uVar30 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var36);
  iVar72 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var36);
  iVar25 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var36);
  uVar47 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var36 + 4)) /
           (long)(iVar25 * iVar72);
  uVar47 = (long)((ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff) /
           (long)(int)uVar30;
  if ((((iVar72 == iVar25 && opt->use_packing_layout == false) &&
       (iVar34 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var36), iVar34 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var36) == iVar34)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var36) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var36) == 1)))) {
    pLVar20 = create_layer(6);
    this->convolution_dilation1 = pLVar20;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86_avx512[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86_avx512[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var3 = this->_vptr_Convolution_x86_avx512;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var3[-3]) == 0) {
      local_1b8 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1d8 = (Allocator *)0x0;
      iStack_1d0 = 0;
      iStack_1cc = 0;
      uStack_1c8._0_4_ = 0;
      uStack_1c8._4_4_ = 0;
      aiStack_1c0[0] = 0;
      p_Var36 = pp_Var3[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var36)) {
        piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var36);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var36);
        uVar1 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var36);
        pd.d._0_4_ = (undefined4)uVar1;
        pd.d._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
        local_1d8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var36);
        uVar1 = *(undefined8 *)((long)&this->gemm + (long)p_Var36);
        uStack_1c8 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var36);
        iStack_1d0 = (int)uVar1;
        iStack_1cc = (int)((ulong)uVar1 >> 0x20);
        aiStack_1c0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var36);
        local_1b8 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var36);
      }
      pLVar20 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar20->_vptr_Layer[3])(pLVar20,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar27 = 0x40;
      do {
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar27) = 0;
        *(undefined1 (*) [16])(local_248 + lVar27 + 0x10) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(local_248 + lVar27 + 0x1c) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd_6._vptr_ParamDict + lVar27) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd_6.d + lVar27 + 4) = (undefined1  [16])0x0;
        lVar27 = lVar27 + 0x48;
      } while (lVar27 != 0xd0);
      p_Var36 = pp_Var3[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var36)) {
        piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var36);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_1d8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1d8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var36);
        uVar1 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var36);
        pd.d._0_4_ = (undefined4)uVar1;
        pd.d._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
        local_1d8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var36);
        uVar1 = *(undefined8 *)((long)&this->gemm + (long)p_Var36);
        uStack_1c8 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var36);
        iStack_1d0 = (int)uVar1;
        iStack_1cc = (int)((ulong)uVar1 >> 0x20);
        aiStack_1c0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var36);
        local_1b8 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var36);
      }
      p_Var36 = this->_vptr_Convolution_x86_avx512[-3];
      if (&local_1b0 != (void **)((long)&(this->scale_in_data).elempack + (long)p_Var36)) {
        piVar4 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var36);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(uStack_1a4,uStack_1a8);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_190 == (long *)0x0) {
              if (local_1b0 != (void *)0x0) {
                free(local_1b0);
              }
            }
            else {
              (**(code **)(*local_190 + 0x18))();
            }
          }
        }
        local_1b0 = *(void **)((long)&(this->scale_in_data).elempack + (long)p_Var36);
        uVar1 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var36);
        uStack_1a8 = (undefined4)uVar1;
        uStack_1a4 = (undefined4)((ulong)uVar1 >> 0x20);
        uStack_1a0 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var36);
        uStack_198 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var36);
        local_190 = *(long **)((long)&(this->scale_in_data).c + (long)p_Var36);
        local_188 = *(undefined1 (*) [16])((long)&(this->scale_in_data).cstep + (long)p_Var36);
        local_178 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var36);
        local_170 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var36);
      }
      pLVar20 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar20->_vptr_Layer[3])(pLVar20,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar27 = 0x48;
      do {
        piVar4 = *(int **)((long)&pd.d + lVar27);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar7 = *(void **)((long)&pd._vptr_ParamDict + lVar27);
            if (*(long **)((long)&local_1d8 + lVar27) == (long *)0x0) {
              if (pvVar7 != (void *)0x0) {
                free(pvVar7);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_1d8 + lVar27) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_1b8 + lVar27) = 0;
        *(undefined1 (*) [16])((long)&pd.d + lVar27 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar27) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&iStack_1d0 + lVar27) = (undefined1  [16])0x0;
        *(undefined4 *)((long)aiStack_1c0 + lVar27) = 0;
        lVar27 = lVar27 + -0x48;
      } while (lVar27 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var36 = this->_vptr_Convolution_x86_avx512[-3];
      piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var36);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar7 = *(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var36);
          plVar8 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var36);
          if (plVar8 == (long *)0x0) {
            if (pvVar7 != (void *)0x0) {
              free(pvVar7);
            }
          }
          else {
            (**(code **)(*plVar8 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var36) = 0;
      *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).d + (long)p_Var36) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var36) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&this->gemm + (long)p_Var36) = (undefined1  [16])0x0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var36) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  uVar79 = 1;
  local_398 = 1;
  if (opt->use_packing_layout != false) {
    uVar79 = 0x10;
    local_398 = 0x10;
    if ((uVar47 & 0xf) != 0) {
      if ((uVar47 & 7) == 0) {
        local_398 = 8;
      }
      else {
        local_398 = (ulong)((uint)((uVar47 & 3) == 0) * 3 + 1);
      }
    }
    if ((uVar30 & 0xf) != 0) {
      if ((uVar30 & 7) == 0) {
        uVar79 = 8;
      }
      else {
        uVar79 = (uint)((uVar30 & 3) == 0) * 3 + 1;
      }
    }
  }
  num_input = (uint)uVar47;
  bVar57 = opt->use_winograd23_convolution;
  if ((((bool)bVar57 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar14 = false;
  }
  else {
    bVar14 = 8 < (int)uVar30 || 8 < (int)num_input;
  }
  if ((((iVar25 == 3) && (iVar72 == 3)) && (opt->use_winograd_convolution != false)) &&
     (((bVar14 && (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var36) == 1)) &&
      ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var36) == 1 &&
       ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var36) == 1 &&
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var36) == 1)))))))) {
    lVar27 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var36);
    if ((((lVar27 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var36)) ||
         (*(int *)(lVar27 + 0x2c) == 0)) || (*(int *)(lVar27 + 0x30) == 0)) &&
       (((lVar41 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var36),
         lVar41 == *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var36) ||
         (*(int *)(lVar41 + 0x2c) == 0)) || (*(int *)(lVar41 + 0x30) == 0)))) {
      if ((((int)uVar30 < 0x21) && (opt->use_winograd63_convolution != false)) &&
         ((int)num_input < 0x21)) {
LAB_001d00f9:
        conv3x3s1_winograd63_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var36),
                   &this->weight_winograd63_data,num_input,uVar30,opt);
      }
      else {
        if (opt->use_winograd43_convolution != true) goto LAB_001d02f4;
LAB_001d031b:
        conv3x3s1_winograd43_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var36),
                   &this->weight_winograd43_data,num_input,uVar30,opt);
      }
    }
    else {
      lVar41 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var36);
      if (((lVar41 == *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var36)) ||
          (*(int *)(lVar41 + 0x2c) == 0)) || (*(int *)(lVar41 + 0x30) == 0)) {
        iVar72 = *(int *)(lVar27 + 0x2c);
        iVar25 = *(int *)(lVar27 + 0x30);
        iVar34 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var36 + 4));
        if (((iVar34 < 1) &&
            (iVar59 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var36),
            iVar59 < 1)) &&
           ((iVar17 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var36 + 4)),
            iVar17 < 1 &&
            (iVar44 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var36),
            iVar44 < 1)))) {
          if ((iVar44 == -0xe9 && (iVar17 == -0xe9 && (iVar59 == -0xe9 && iVar34 == -0xe9))) ||
             (iVar44 == -0xea && (iVar17 == -0xea && (iVar59 == -0xea && iVar34 == -0xea)))) {
            iVar72 = iVar72 + 2;
            iVar25 = iVar25 + 2;
          }
        }
        else {
          iVar72 = iVar34 + iVar72 +
                   *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var36);
          iVar25 = iVar25 + *(int *)((long)&(this->weight_winograd43_data).data +
                                    (long)(p_Var36 + 4)) +
                   *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var36);
        }
      }
      else {
        iVar72 = *(int *)(lVar41 + 0x2c) + 2;
        iVar25 = *(int *)(lVar41 + 0x30) + 2;
      }
      local_248._0_4_ = iVar25;
      bVar14 = test_prefer_winograd63(num_input,uVar30,iVar72,iVar25);
      bVar15 = test_prefer_winograd23(num_input,uVar30,iVar72,local_248._0_4_);
      bVar24 = bVar15 & bVar57;
      if (!bVar15) {
        bVar57 = bVar14;
      }
      bVar16 = bVar14 & opt->use_winograd63_convolution;
      bVar57 = (opt->use_winograd63_convolution ^ 1U) & bVar14 | bVar57 ^ 1;
      if ((bVar57 == 1) && (opt->use_winograd43_convolution == false)) {
        bVar16 = bVar16 | opt->use_winograd63_convolution;
        bVar24 = bVar24 | opt->use_winograd63_convolution ^ 1U;
        bVar57 = 0;
      }
      if (bVar24 == 0) {
        if (bVar57 != 0) goto LAB_001d031b;
        if ((bVar16 & 1) != 0) goto LAB_001d00f9;
      }
      else {
LAB_001d02f4:
        conv3x3s1_winograd23_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var36),
                   &this->weight_winograd23_data,num_input,uVar30,opt);
      }
    }
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var6 = this->_vptr_Convolution_x86_avx512[-3];
    p_Var36 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx512 + (long)p_Var6);
    pauVar82 = (undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var6);
    piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var6);
    if (piVar4 == (int *)0x0) goto LAB_001cfef2;
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) goto LAB_001cfef2;
    pvVar7 = *(void **)(p_Var36 + 0x160);
    plVar8 = *(long **)(p_Var36 + 0x180);
  }
  else {
    iVar72 = get_cpu_level2_cache_size();
    p_Var36 = this->_vptr_Convolution_x86_avx512[-3];
    uVar30 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var36);
    auVar2 = *(undefined1 (*) [16])((long)&(this->weight_winograd23_data).w + (long)p_Var36);
    uVar5 = *(undefined8 *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var36);
    uVar1 = *(undefined8 *)((long)&(this->weight_winograd23_data).d + (long)p_Var36);
    auVar88._8_8_ = uVar1;
    auVar88._0_8_ = uVar1;
    local_248 = ZEXT1632(auVar2);
    auVar88 = vpmulld_avx(auVar2,auVar88);
    auVar12 = vpshufd_avx(auVar88,0x55);
    auVar88 = vpmulld_avx(auVar88,auVar12);
    iVar25 = (int)((ulong)uVar5 >> 0x20);
    iVar34 = (int)uVar5;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar72 < (int)(iVar25 * uVar30 * iVar34 * auVar88._0_4_ * num_input * 8) ||
         (0x10 < (int)num_input || 0x10 < (int)uVar30))) ||
       (auVar12._8_4_ = 1, auVar12._0_8_ = 0x100000001, auVar12._12_4_ = 1,
       uVar47 = vpcmpd_avx512vl(auVar2,auVar12,4), (uVar47 & 3) == 0)) {
      pLVar20 = create_layer(0x4a);
      this->gemm = pLVar20;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86_avx512[-3]));
      ParamDict::set(&pd_6,8,0);
      auVar2 = vpshufd_avx(local_248._0_16_,0x55);
      auVar2 = vpmulld_avx(auVar2,local_248._0_16_);
      uVar30 = auVar2._0_4_;
      ParamDict::set(&pd_6,9,uVar30 * num_input);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86_avx512[-3]) == 0) |
                              1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      this_00 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                       (long)this->_vptr_Convolution_x86_avx512[-3]);
      Mat::reshape((Mat *)&pd,this_00,uVar30,num_input,*(int *)&this_00[-2].data,(Allocator *)0x0);
      Mat::create((Mat *)&pd_5,uVar30 * num_input,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86_avx512[-3]),4,(Allocator *)0x0);
      pp_Var3 = this->_vptr_Convolution_x86_avx512;
      if (0 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var3[-3])) {
        local_248._0_8_ = pd_5._vptr_ParamDict;
        lVar27 = 0;
        do {
          if ((int)local_398 <= (int)num_input) {
            pp_Var31 = (_func_int **)(local_1e8 * local_1b8 * lVar27 + (long)pd._vptr_ParamDict);
            lVar41 = 0;
            pp_Var65 = pd_5._vptr_ParamDict;
            do {
              if (0 < (int)uVar30) {
                uVar35 = 0;
                uVar47 = local_398;
                pp_Var81 = pp_Var31;
                pp_Var80 = pp_Var31;
                do {
                  do {
                    *(undefined4 *)pp_Var65 = *(undefined4 *)pp_Var81;
                    pp_Var65 = (_func_int **)((long)pp_Var65 + 4);
                    uVar47 = uVar47 - 1;
                    pp_Var81 = (_func_int **)((long)pp_Var81 + (long)iStack_1cc * local_1e8);
                  } while (uVar47 != 0);
                  uVar35 = uVar35 + 1;
                  pp_Var81 = (_func_int **)((long)pp_Var80 + 4);
                  uVar47 = local_398;
                  pp_Var80 = pp_Var81;
                } while (uVar35 != uVar30);
              }
              lVar41 = lVar41 + local_398;
              pp_Var31 = (_func_int **)((long)pp_Var31 + (long)iStack_1cc * local_1e8 * local_398);
            } while (lVar41 < (long)((long)(int)num_input - (ulong)((int)local_398 - 1)));
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var3[-3]));
      }
      piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(this->weight_winograd43_data).elemsize +
                  (long)this->_vptr_Convolution_x86_avx512[-3]) == 0) {
        piVar4 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_1d8 = (Allocator *)0x0;
        iStack_1d0 = 0;
        iStack_1cc = 0;
        uStack_1c8._0_4_ = 0;
        uStack_1c8._4_4_ = 0;
        aiStack_1c0[0] = 0;
        local_1b8 = 0;
        pLVar20 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
        (*pLVar20->_vptr_Layer[3])(pLVar20,&local_40);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
        piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_1d8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1d8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        lVar27 = 0x40;
        do {
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar27) = 0;
          *(undefined1 (*) [16])(local_248 + lVar27 + 0x10) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(local_248 + lVar27 + 0x1c) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd_6._vptr_ParamDict + lVar27) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd_6.d + lVar27 + 4) = (undefined1  [16])0x0;
          lVar27 = lVar27 + 0x48;
        } while (lVar27 != 0xd0);
        piVar4 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_1d8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1d8->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_1d8 = (Allocator *)0x0;
        iStack_1d0 = 0;
        iStack_1cc = 0;
        uStack_1c8._0_4_ = 0;
        uStack_1c8._4_4_ = 0;
        aiStack_1c0[0] = 0;
        local_1b8 = 0;
        p_Var36 = this->_vptr_Convolution_x86_avx512[-3];
        if (&local_1b0 != (void **)((long)&(this->scale_in_data).elempack + (long)p_Var36)) {
          piVar4 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var36);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = (int *)CONCAT44(uStack_1a4,uStack_1a8);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_190 == (long *)0x0) {
                if (local_1b0 != (void *)0x0) {
                  free(local_1b0);
                }
              }
              else {
                (**(code **)(*local_190 + 0x18))();
              }
            }
          }
          local_1b0 = *(void **)((long)&(this->scale_in_data).elempack + (long)p_Var36);
          uVar1 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var36);
          uStack_1a8 = (undefined4)uVar1;
          uStack_1a4 = (undefined4)((ulong)uVar1 >> 0x20);
          uStack_1a0 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var36);
          uStack_198 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var36);
          local_190 = *(long **)((long)&(this->scale_in_data).c + (long)p_Var36);
          local_188 = *(undefined1 (*) [16])((long)&(this->scale_in_data).cstep + (long)p_Var36);
          local_178 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var36);
          local_170 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var36);
        }
        pLVar20 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
        (*pLVar20->_vptr_Layer[3])(pLVar20,&local_40);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
        lVar27 = 0x48;
        do {
          piVar4 = *(int **)((long)&pd.d + lVar27);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar7 = *(void **)((long)&pd._vptr_ParamDict + lVar27);
              if (*(long **)((long)&local_1d8 + lVar27) == (long *)0x0) {
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_1d8 + lVar27) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1b8 + lVar27) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar27 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar27) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&iStack_1d0 + lVar27) = (undefined1  [16])0x0;
          *(undefined4 *)((long)aiStack_1c0 + lVar27) = 0;
          lVar27 = lVar27 + -0x48;
        } while (lVar27 != -0x48);
      }
      (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
      piVar4 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if ((*piVar4 == 0) && (pd_5._vptr_ParamDict != (_func_int **)0x0)) {
          free(pd_5._vptr_ParamDict);
        }
      }
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      ParamDict::~ParamDict(&pd_6);
    }
    else {
      local_138 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx512 + (long)p_Var36);
      auVar88 = vpinsrd_avx(ZEXT416(uVar79),(int)local_398,1);
      auVar13 = vpermq_avx2(local_248,0xd0);
      auVar13 = vpblendd_avx2(auVar13,ZEXT1632(auVar88),3);
      auVar89._8_8_ = uVar5;
      auVar89._0_8_ = uVar5;
      auVar89._16_8_ = uVar5;
      auVar89._24_8_ = uVar5;
      auVar13 = vpblendd_avx2(auVar13,auVar89,0xc0);
      iVar59 = auVar2._0_4_;
      iVar72 = auVar2._4_4_;
      if (auVar13 != _DAT_00598280) {
        iVar44 = auVar2._8_4_;
        iVar17 = auVar2._12_4_;
        if ((((((uVar79 != 8) || ((int)local_398 != 8)) ||
              (((iVar59 != 3 ||
                ((((iVar72 != 3 || (iVar44 != 1)) || (iVar17 != 1)) ||
                 ((iVar34 != 1 || (iVar25 != 1)))))) &&
               ((iVar59 != 2 ||
                (((iVar72 != 2 || (iVar44 != 1)) ||
                 ((iVar17 != 1 || ((iVar34 != 1 || (iVar25 != 1)))))))))))) &&
             (((uVar79 != 8 || ((int)local_398 != 1)) ||
              (((((iVar59 != 3 || (iVar72 != 3)) || (iVar44 != 1)) ||
                (((iVar17 != 1 || (iVar34 != 1)) || (iVar25 != 1)))) &&
               (((iVar59 != 3 || (iVar72 != 3)) ||
                ((iVar44 != 1 || (((iVar17 != 1 || (iVar34 != 2)) || (iVar25 != 2)))))))))))) &&
            (((uVar47 = vpcmpeqd_avx512vl(auVar13,_DAT_00598280), (uVar47 & 1) == 0 ||
              ((int)local_398 != 8)) ||
             ((iVar59 != 3 ||
              (((iVar72 != 3 || (iVar44 != 1)) ||
               ((iVar17 != 1 || ((iVar34 != 1 || (iVar25 != 1)))))))))))) &&
           (((uVar79 != 4 || ((int)local_398 != 1)) ||
            ((((((iVar59 != 3 || (iVar72 != 3)) || (iVar44 != 1)) ||
               ((iVar17 != 1 || (iVar34 != 1)))) || (iVar25 != 1)) &&
             (((iVar59 != 3 || (iVar72 != 3)) ||
              ((iVar44 != 1 || (((iVar17 != 1 || (iVar34 != 2)) || (iVar25 != 2)))))))))))) {
          uVar47 = (ulong)(int)uVar30;
          uVar73 = iVar72 * iVar59;
          uVar35 = (ulong)uVar73;
          uVar79 = num_input;
          if ((int)uVar30 < 0x10) {
            if ((int)uVar30 < 8) {
              if ((int)uVar30 < 4) {
                if ((int)uVar30 < 2) {
                  uVar26 = uVar30;
                  if ((int)num_input < 0x10) {
                    if ((int)num_input < 8) {
                      if ((int)num_input < 4) {
                        uVar79 = uVar73;
                        uVar19 = num_input;
                        if (1 < (int)num_input) {
                          uVar79 = uVar73 * 2;
                          uVar19 = (num_input & 1) + 1;
                        }
                      }
                      else {
                        uVar79 = uVar73 * 4;
                        uVar19 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                      }
                    }
                    else {
                      uVar79 = uVar73 * 8;
                      uVar19 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                               (uint)((num_input >> 1 & 1) != 0);
                    }
                  }
                  else {
                    uVar79 = uVar73 * 0x10;
                    uVar19 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0)
                             + (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
                  }
                }
                else {
                  if ((int)num_input < 0x10) {
                    if ((int)num_input < 8) {
                      if ((int)num_input < 4) {
                        if ((int)num_input < 2) {
                          iVar25 = uVar73 * 2;
                          iVar72 = (uVar30 & 1) + 1;
                          goto LAB_001d087b;
                        }
                        uVar79 = uVar73 * 4;
                        uVar19 = (num_input & 1) + 1;
                      }
                      else {
                        uVar19 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                        uVar79 = uVar73 * 8;
                      }
                    }
                    else {
                      uVar79 = uVar73 * 0x10;
                      uVar19 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                               (uint)((num_input >> 1 & 1) != 0);
                    }
                  }
                  else {
                    uVar79 = uVar73 * 0x20;
                    uVar19 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0)
                             + (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
                  }
                  uVar26 = (uVar30 & 1) + 1;
                }
              }
              else {
                if ((int)num_input < 0x10) {
                  if ((int)num_input < 8) {
                    if ((int)num_input < 4) {
                      if (1 < (int)num_input) {
                        uVar79 = uVar73 * 8;
                        uVar19 = (num_input & 1) + 1;
                        goto LAB_001d0b3b;
                      }
                      iVar25 = uVar73 * 4;
                      iVar72 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
                    }
                    else {
                      iVar25 = uVar73 * 0x10;
                      uVar79 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                      iVar72 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
                    }
                    goto LAB_001d087b;
                  }
                  uVar79 = uVar73 * 0x20;
                  uVar19 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                           (uint)((num_input >> 1 & 1) != 0);
                }
                else {
                  uVar79 = uVar73 * 0x40;
                  uVar19 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0) +
                           (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
                }
LAB_001d0b3b:
                uVar26 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
              }
            }
            else {
              if ((int)num_input < 0x10) {
                if ((int)num_input < 8) {
                  if ((int)num_input < 4) {
                    if ((int)num_input < 2) {
                      iVar25 = uVar73 * 8;
                      iVar72 = (uVar30 & 1) + 1 + (uVar30 >> 2 & 1) + (uint)((uVar30 >> 1 & 1) != 0)
                      ;
                      goto LAB_001d087b;
                    }
                    iVar25 = uVar73 * 0x10;
                    uVar79 = (num_input & 1) + 1;
                    uVar19 = uVar30 >> 2 & 1;
                    iVar72 = (uVar30 & 1) + 1;
                    bVar14 = (uVar30 >> 1 & 1) != 0;
                  }
                  else {
                    iVar25 = uVar73 * 0x20;
                    uVar79 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                    uVar19 = uVar30 >> 2 & 1;
                    iVar72 = (uVar30 & 1) + 1;
                    bVar14 = (uVar30 >> 1 & 1) != 0;
                  }
                }
                else {
                  iVar25 = uVar73 * 0x40;
                  uVar79 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                           (uint)((num_input >> 1 & 1) != 0);
                  uVar19 = uVar30 >> 2 & 1;
                  iVar72 = (uVar30 & 1) + 1;
                  bVar14 = (uVar30 >> 1 & 1) != 0;
                }
                iVar72 = iVar72 + uVar19 + (uint)bVar14;
                goto LAB_001d087b;
              }
              uVar79 = uVar73 * 0x80;
              uVar19 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0) +
                       (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
              uVar26 = (uVar30 & 1) + 1 + (uVar30 >> 2 & 1) + (uint)((uVar30 >> 1 & 1) != 0);
            }
            Mat::create(&this->weight_data_tm,uVar79,uVar19,uVar26,4,(Allocator *)0x0);
          }
          else {
            if ((int)num_input < 0x10) {
              if ((int)num_input < 8) {
                if ((int)num_input < 4) {
                  if ((int)num_input < 2) {
                    iVar25 = uVar73 * 0x10;
                    iVar72 = (uVar30 & 1) + (uVar30 >> 4) + (uint)((uVar30 >> 3 & 1) != 0) +
                             (uVar30 >> 2 & 1) + (uint)((uVar30 >> 1 & 1) != 0);
                    goto LAB_001d087b;
                  }
                  iVar25 = uVar73 * 0x20;
                  uVar79 = (num_input & 1) + 1;
                }
                else {
                  iVar25 = uVar73 * 0x40;
                  uVar79 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                }
              }
              else {
                iVar25 = uVar73 * 0x80;
                uVar79 = (num_input & 1) + 1 + (num_input >> 2 & 1) +
                         (uint)((num_input >> 1 & 1) != 0);
              }
            }
            else {
              iVar25 = uVar73 * 0x100;
              uVar79 = (num_input & 1) + (num_input >> 4) + (uint)((num_input >> 3 & 1) != 0) +
                       (num_input >> 2 & 1) + (uint)((num_input >> 1 & 1) != 0);
            }
            iVar72 = (uVar30 & 1) + (uVar30 >> 4) + (uint)((uVar30 >> 3 & 1) != 0) +
                     (uVar30 >> 2 & 1) + (uint)((uVar30 >> 1 & 1) != 0);
LAB_001d087b:
            Mat::create(&this->weight_data_tm,iVar25,uVar79,iVar72,4,(Allocator *)0x0);
          }
          uVar28 = 0;
          local_160 = (long)(int)uVar73;
          lVar27 = (long)(int)num_input;
          if (0xf < (int)uVar30) {
            iVar58 = uVar73 * num_input;
            sVar9 = (this->weight_data_tm).elemsize;
            sVar10 = (this->weight_data_tm).cstep;
            iVar18 = uVar73 * num_input;
            local_120 = (ulong)(uint)(iVar18 * 2);
            iVar72 = iVar18 * 3;
            local_228 = (ulong)(uint)(iVar18 * 4);
            iVar25 = iVar18 * 5;
            iVar84 = iVar18 * 8;
            iVar34 = iVar18 * 7;
            iVar69 = iVar18 * 0xb;
            iVar50 = iVar18 * 0xd;
            iVar45 = iVar18 * 0x10;
            local_100 = uVar35 * 0x40;
            iVar46 = iVar18 * 0xe;
            local_108 = local_160 * 0x20;
            local_110 = local_160 * 0x10;
            lVar11 = *(long *)(local_138 + 0x160);
            pvVar7 = (this->weight_data_tm).data;
            lVar41 = local_160 * 4;
            iVar59 = iVar18 * 6;
            iVar17 = iVar18 * 10;
            iVar64 = iVar18 * 0xc;
            iVar44 = iVar18 * 0xf;
            local_118 = uVar35 * 4;
            local_158 = 0;
            uVar49 = 0;
            iVar18 = iVar18 * 9;
            do {
              local_13c = iVar18;
              iVar18 = (int)local_228;
              local_390 = (undefined4 *)((uVar49 >> 4) * sVar9 * sVar10 + (long)pvVar7);
              local_128 = CONCAT44(local_128._4_4_,iVar58);
              local_130 = CONCAT44(local_130._4_4_,iVar84);
              if ((int)num_input < 0x10) {
                uVar28 = 0;
              }
              else {
                lVar29 = lVar11 + (long)(int)local_158 * 4;
                local_248._0_8_ = lVar29;
                lVar22 = 0;
                uVar77 = 0;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar21 = lVar22;
                    do {
                      puVar68 = local_390;
                      lVar48 = 0;
                      lVar51 = lVar21;
                      do {
                        *(undefined4 *)((long)puVar68 + lVar48) = *(undefined4 *)(lVar29 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 4) =
                             *(undefined4 *)(lVar11 + (long)iVar58 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 8) =
                             *(undefined4 *)(lVar11 + (long)(int)local_120 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0xc) =
                             *(undefined4 *)(lVar11 + (long)iVar72 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x10) =
                             *(undefined4 *)(lVar11 + (long)iVar18 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x14) =
                             *(undefined4 *)(lVar11 + (long)iVar25 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x18) =
                             *(undefined4 *)(lVar11 + (long)iVar59 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x1c) =
                             *(undefined4 *)(lVar11 + (long)iVar34 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x20) =
                             *(undefined4 *)(lVar11 + (long)iVar84 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x24) =
                             *(undefined4 *)(lVar11 + (long)local_13c * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x28) =
                             *(undefined4 *)(lVar11 + (long)iVar17 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x2c) =
                             *(undefined4 *)(lVar11 + (long)iVar69 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x30) =
                             *(undefined4 *)(lVar11 + (long)iVar64 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x34) =
                             *(undefined4 *)(lVar11 + (long)iVar50 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x38) =
                             *(undefined4 *)(lVar11 + (long)iVar46 * 4 + lVar51);
                        *(undefined4 *)((long)puVar68 + lVar48 + 0x3c) =
                             *(undefined4 *)(lVar11 + (long)iVar44 * 4 + lVar51);
                        lVar48 = lVar48 + 0x40;
                        lVar51 = lVar51 + lVar41;
                      } while ((int)lVar48 != 0x400);
                      uVar28 = uVar28 + 1;
                      lVar21 = lVar21 + 4;
                      local_390 = (undefined4 *)((long)puVar68 + lVar48);
                    } while (uVar28 != uVar35);
                    local_390 = (undefined4 *)((long)puVar68 + lVar48);
                  }
                  uVar28 = uVar77 + 0x10;
                  lVar21 = uVar77 + 0x1f;
                  lVar22 = lVar22 + local_100;
                  uVar77 = uVar28;
                } while (lVar21 < lVar27);
              }
              lVar29 = (long)iVar44 * 4;
              lVar37 = (long)iVar46 * 4;
              lVar85 = (long)iVar50 * 4;
              lVar70 = (long)iVar64 * 4;
              lVar60 = (long)iVar69 * 4;
              lVar83 = (long)iVar17 * 4;
              local_220 = (long)local_13c * 4;
              local_148 = (long)iVar84 * 4;
              lVar67 = (long)iVar34 * 4;
              lVar21 = (long)iVar59 * 4;
              lVar74 = (long)iVar25 * 4;
              lVar51 = (long)iVar18 * 4;
              lVar62 = (long)iVar72 * 4;
              lVar48 = (long)(int)local_120 * 4;
              lVar22 = (long)iVar58 * 4;
              local_150 = (long)(int)local_158 * 4;
              if ((int)((uint)uVar28 | 7) < (int)num_input) {
                lVar38 = lVar41 * (uVar28 & 0xffffffff);
                lVar39 = lVar38 + lVar29 + lVar11;
                lVar43 = 0;
                local_248._0_8_ = lVar39;
                uVar77 = uVar28 & 0xffffffff;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar42 = lVar43;
                    do {
                      puVar68 = local_390;
                      lVar75 = 0;
                      lVar61 = lVar42;
                      do {
                        *(undefined4 *)((long)puVar68 + lVar75) =
                             *(undefined4 *)(lVar38 + local_150 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 4) =
                             *(undefined4 *)(lVar38 + lVar22 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 8) =
                             *(undefined4 *)(lVar38 + lVar48 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0xc) =
                             *(undefined4 *)(lVar38 + lVar62 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x10) =
                             *(undefined4 *)(lVar38 + lVar51 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x14) =
                             *(undefined4 *)(lVar38 + lVar74 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x18) =
                             *(undefined4 *)(lVar21 + lVar38 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x1c) =
                             *(undefined4 *)(lVar38 + lVar67 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x20) =
                             *(undefined4 *)(local_148 + lVar38 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x24) =
                             *(undefined4 *)(lVar38 + local_220 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x28) =
                             *(undefined4 *)(lVar38 + lVar83 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x2c) =
                             *(undefined4 *)(lVar38 + lVar60 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x30) =
                             *(undefined4 *)(lVar38 + lVar70 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x34) =
                             *(undefined4 *)(lVar38 + lVar85 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x38) =
                             *(undefined4 *)(lVar37 + lVar38 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x3c) =
                             *(undefined4 *)(lVar39 + lVar61);
                        lVar75 = lVar75 + 0x40;
                        lVar61 = lVar61 + lVar41;
                      } while ((int)lVar75 != 0x200);
                      uVar28 = uVar28 + 1;
                      lVar42 = lVar42 + 4;
                      local_390 = (undefined4 *)((long)puVar68 + lVar75);
                    } while (uVar28 != uVar35);
                    local_390 = (undefined4 *)((long)puVar68 + lVar75);
                  }
                  uVar28 = uVar77 + 8;
                  lVar42 = uVar77 + 0xf;
                  lVar43 = lVar43 + local_108;
                  uVar77 = uVar28;
                } while (lVar42 < lVar27);
              }
              if ((int)((uint)uVar28 | 3) < (int)num_input) {
                lVar39 = lVar41 * (uVar28 & 0xffffffff);
                lVar43 = lVar39 + lVar60 + lVar11;
                lVar38 = 0;
                local_248._0_8_ = lVar43;
                uVar77 = uVar28 & 0xffffffff;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar42 = lVar38;
                    do {
                      puVar68 = local_390;
                      lVar75 = 0;
                      lVar61 = lVar42;
                      do {
                        *(undefined4 *)((long)puVar68 + lVar75) =
                             *(undefined4 *)(local_150 + lVar39 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 4) =
                             *(undefined4 *)(lVar39 + lVar22 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 8) =
                             *(undefined4 *)(lVar39 + lVar48 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0xc) =
                             *(undefined4 *)(lVar39 + lVar62 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x10) =
                             *(undefined4 *)(lVar39 + lVar51 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x14) =
                             *(undefined4 *)(lVar39 + lVar74 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x18) =
                             *(undefined4 *)(lVar39 + lVar21 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x1c) =
                             *(undefined4 *)(lVar39 + lVar67 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x20) =
                             *(undefined4 *)(lVar39 + local_148 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x24) =
                             *(undefined4 *)(lVar39 + local_220 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x28) =
                             *(undefined4 *)(lVar83 + lVar39 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x2c) =
                             *(undefined4 *)(lVar43 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x30) =
                             *(undefined4 *)(lVar70 + lVar39 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x34) =
                             *(undefined4 *)(lVar85 + lVar39 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x38) =
                             *(undefined4 *)(lVar37 + lVar39 + lVar11 + lVar61);
                        *(undefined4 *)((long)puVar68 + lVar75 + 0x3c) =
                             *(undefined4 *)(lVar29 + lVar39 + lVar11 + lVar61);
                        lVar75 = lVar75 + 0x40;
                        lVar61 = lVar61 + lVar41;
                      } while ((int)lVar75 != 0x100);
                      uVar28 = uVar28 + 1;
                      lVar42 = lVar42 + 4;
                      local_390 = (undefined4 *)((long)puVar68 + lVar75);
                    } while (uVar28 != uVar35);
                    local_390 = (undefined4 *)((long)puVar68 + lVar75);
                  }
                  uVar28 = uVar77 + 4;
                  lVar42 = uVar77 + 7;
                  lVar38 = lVar38 + local_110;
                  uVar77 = uVar28;
                } while (lVar42 < lVar27);
              }
              uVar79 = (uint)uVar28;
              if ((int)(uVar79 | 1) < (int)num_input) {
                lVar39 = lVar41 * (int)uVar79;
                lVar43 = lVar39 + local_150 + lVar11;
                local_248._0_8_ = lVar43;
                lVar42 = 0;
                lVar38 = (long)(int)uVar79;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar61 = lVar42;
                    do {
                      puVar68 = local_390;
                      lVar76 = 0;
                      lVar75 = lVar61;
                      do {
                        *(undefined4 *)((long)puVar68 + lVar76) = *(undefined4 *)(lVar43 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 4) =
                             *(undefined4 *)(lVar22 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 8) =
                             *(undefined4 *)(lVar48 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0xc) =
                             *(undefined4 *)(lVar62 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x10) =
                             *(undefined4 *)(lVar51 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x14) =
                             *(undefined4 *)(lVar74 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x18) =
                             *(undefined4 *)(lVar21 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x1c) =
                             *(undefined4 *)(lVar67 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x20) =
                             *(undefined4 *)(local_148 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x24) =
                             *(undefined4 *)(local_220 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x28) =
                             *(undefined4 *)(lVar83 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x2c) =
                             *(undefined4 *)(lVar60 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x30) =
                             *(undefined4 *)(lVar70 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x34) =
                             *(undefined4 *)(lVar85 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x38) =
                             *(undefined4 *)(lVar37 + lVar39 + lVar11 + lVar75);
                        *(undefined4 *)((long)puVar68 + lVar76 + 0x3c) =
                             *(undefined4 *)(lVar29 + lVar39 + lVar11 + lVar75);
                        lVar76 = lVar76 + 0x40;
                        lVar75 = lVar75 + lVar41;
                      } while ((int)lVar76 == 0x40);
                      uVar28 = uVar28 + 1;
                      lVar61 = lVar61 + 4;
                      local_390 = (undefined4 *)((long)puVar68 + lVar76);
                    } while (uVar28 != uVar35);
                    local_390 = (undefined4 *)((long)puVar68 + lVar76);
                  }
                  lVar61 = lVar38 + 2;
                  lVar75 = lVar38 + 3;
                  lVar42 = lVar42 + local_160 * 8;
                  lVar38 = lVar61;
                } while (lVar75 < lVar27);
                uVar79 = (uint)lVar61;
              }
              if ((int)uVar79 < (int)num_input) {
                local_380 = (long)(int)uVar79;
                lVar38 = lVar41 * local_380;
                lVar39 = lVar29 + lVar38 + lVar11;
                local_2f0 = lVar37 + lVar38 + lVar11;
                local_2f8 = lVar85 + lVar38 + lVar11;
                local_2c0 = lVar70 + lVar38 + lVar11;
                local_2e8 = lVar60 + lVar38 + lVar11;
                local_2e0 = lVar83 + lVar38 + lVar11;
                lVar60 = local_220 + lVar38 + lVar11;
                lVar29 = local_148 + lVar38 + lVar11;
                lVar67 = lVar67 + lVar38 + lVar11;
                lVar37 = lVar21 + lVar38 + lVar11;
                lVar70 = lVar74 + lVar38 + lVar11;
                local_368 = lVar51 + lVar38 + lVar11;
                local_330 = lVar62 + lVar38 + lVar11;
                lVar21 = lVar48 + lVar38 + lVar11;
                lVar22 = lVar22 + lVar38 + lVar11;
                lVar51 = lVar38 + local_150 + lVar11;
                do {
                  local_248._0_8_ = lVar51;
                  if (0 < (int)uVar73) {
                    lVar48 = 0;
                    do {
                      *local_390 = *(undefined4 *)(lVar51 + lVar48);
                      local_390[1] = *(undefined4 *)(lVar22 + lVar48);
                      local_390[2] = *(undefined4 *)(lVar21 + lVar48);
                      local_390[3] = *(undefined4 *)(local_330 + lVar48);
                      local_390[4] = *(undefined4 *)(local_368 + lVar48);
                      local_390[5] = *(undefined4 *)(lVar70 + lVar48);
                      local_390[6] = *(undefined4 *)(lVar37 + lVar48);
                      local_390[7] = *(undefined4 *)(lVar67 + lVar48);
                      local_390[8] = *(undefined4 *)(lVar29 + lVar48);
                      local_390[9] = *(undefined4 *)(lVar60 + lVar48);
                      local_390[10] = *(undefined4 *)(local_2e0 + lVar48);
                      local_390[0xb] = *(undefined4 *)(local_2e8 + lVar48);
                      local_390[0xc] = *(undefined4 *)(local_2c0 + lVar48);
                      local_390[0xd] = *(undefined4 *)(local_2f8 + lVar48);
                      local_390[0xe] = *(undefined4 *)(local_2f0 + lVar48);
                      local_390[0xf] = *(undefined4 *)(lVar39 + lVar48);
                      local_390 = local_390 + 0x10;
                      lVar48 = lVar48 + 4;
                    } while (local_118 != lVar48);
                  }
                  local_380 = local_380 + 1;
                  lVar39 = lVar39 + lVar41;
                  local_2f0 = local_2f0 + lVar41;
                  local_2f8 = local_2f8 + lVar41;
                  local_2c0 = local_2c0 + lVar41;
                  local_2e8 = local_2e8 + lVar41;
                  local_2e0 = local_2e0 + lVar41;
                  lVar60 = lVar60 + lVar41;
                  lVar29 = lVar29 + lVar41;
                  lVar67 = lVar67 + lVar41;
                  lVar37 = lVar37 + lVar41;
                  lVar70 = lVar70 + lVar41;
                  local_368 = local_368 + lVar41;
                  local_330 = local_330 + lVar41;
                  lVar21 = lVar21 + lVar41;
                  lVar22 = lVar22 + lVar41;
                  lVar51 = lVar51 + lVar41;
                } while (local_380 != lVar27);
              }
              uVar28 = uVar49 + 0x10;
              uVar77 = uVar49 + 0x1f;
              local_158 = (ulong)(uint)((int)local_158 + iVar45);
              iVar58 = iVar58 + iVar45;
              local_120 = (ulong)(uint)((int)local_120 + iVar45);
              iVar72 = iVar72 + iVar45;
              local_228 = (ulong)(uint)(iVar18 + iVar45);
              iVar25 = iVar25 + iVar45;
              iVar59 = iVar59 + iVar45;
              iVar34 = iVar34 + iVar45;
              iVar84 = iVar84 + iVar45;
              iVar17 = iVar17 + iVar45;
              iVar69 = iVar69 + iVar45;
              iVar64 = iVar64 + iVar45;
              iVar50 = iVar50 + iVar45;
              iVar46 = iVar46 + iVar45;
              iVar44 = iVar44 + iVar45;
              uVar49 = uVar28;
              iVar18 = local_13c + iVar45;
            } while (uVar77 < uVar30);
          }
          uVar79 = (uint)uVar28;
          if ((int)(uVar79 | 7) < (int)uVar30) {
            lVar11 = *(long *)(local_138 + 0x160);
            sVar9 = (this->weight_data_tm).elemsize;
            sVar10 = (this->weight_data_tm).cstep;
            pvVar7 = (this->weight_data_tm).data;
            iVar59 = uVar73 * num_input;
            iVar34 = (uVar79 | 7) * iVar59;
            iVar72 = iVar59 * 8;
            iVar44 = (uVar79 + 6) * iVar59;
            iVar64 = (uVar79 + 5) * iVar59;
            iVar69 = (uVar79 + 4) * iVar59;
            iVar25 = (uVar79 + 3) * iVar59;
            iVar17 = (uVar79 + 2) * iVar59;
            iVar50 = (uVar79 + 1) * iVar59;
            iVar59 = iVar59 * uVar79;
            lVar41 = local_160 * 4;
            uVar49 = uVar28 & 0xffffffff;
            do {
              puVar68 = (undefined4 *)
                        ((ulong)(((uint)(uVar49 >> 4) & 0xfffffff) +
                                (uint)(((uint)uVar49 >> 3 & 1) != 0)) * sVar9 * sVar10 +
                        (long)pvVar7);
              if ((int)num_input < 0x10) {
                uVar28 = 0;
              }
              else {
                local_398 = 0;
                uVar77 = 0;
                do {
                  if (0 < (int)uVar73) {
                    uVar63 = 0;
                    uVar28 = local_398;
                    do {
                      puVar33 = puVar68;
                      lVar22 = 0;
                      lVar29 = uVar28;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar22) =
                             *(undefined4 *)(lVar11 + (long)iVar59 * 4 + lVar29);
                        *(undefined4 *)((long)puVar33 + lVar22 + 4) =
                             *(undefined4 *)(lVar11 + (long)iVar50 * 4 + lVar29);
                        *(undefined4 *)((long)puVar33 + lVar22 + 8) =
                             *(undefined4 *)(lVar11 + (long)iVar17 * 4 + lVar29);
                        *(undefined4 *)((long)puVar33 + lVar22 + 0xc) =
                             *(undefined4 *)(lVar11 + (long)iVar25 * 4 + lVar29);
                        *(undefined4 *)((long)puVar33 + lVar22 + 0x10) =
                             *(undefined4 *)(lVar11 + (long)iVar69 * 4 + lVar29);
                        *(undefined4 *)((long)puVar33 + lVar22 + 0x14) =
                             *(undefined4 *)(lVar11 + (long)iVar64 * 4 + lVar29);
                        *(undefined4 *)((long)puVar33 + lVar22 + 0x18) =
                             *(undefined4 *)(lVar11 + (long)iVar44 * 4 + lVar29);
                        *(undefined4 *)((long)puVar33 + lVar22 + 0x1c) =
                             *(undefined4 *)(lVar11 + (long)iVar34 * 4 + lVar29);
                        lVar22 = lVar22 + 0x20;
                        lVar29 = lVar29 + lVar41;
                      } while ((int)lVar22 != 0x200);
                      uVar63 = uVar63 + 1;
                      uVar28 = uVar28 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar22);
                    } while (uVar63 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar22);
                  }
                  uVar28 = uVar77 + 0x10;
                  lVar29 = uVar77 + 0x1f;
                  local_398 = local_398 + uVar35 * 0x40;
                  uVar77 = uVar28;
                } while (lVar29 < lVar27);
              }
              lVar37 = (long)iVar34 * 4;
              local_248._0_8_ = (long)iVar44 * 4;
              lVar51 = (long)iVar64 * 4;
              lVar21 = (long)iVar69 * 4;
              lVar22 = (long)iVar25 * 4;
              lVar60 = (long)iVar17 * 4;
              lVar48 = (long)iVar50 * 4;
              lVar29 = (long)iVar59 * 4;
              if ((int)((uint)uVar28 | 7) < (int)num_input) {
                lVar62 = lVar41 * (uVar28 & 0xffffffff);
                lVar67 = 0;
                uVar77 = uVar28 & 0xffffffff;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar70 = lVar67;
                    do {
                      puVar33 = puVar68;
                      lVar83 = 0;
                      lVar74 = lVar70;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar83) =
                             *(undefined4 *)(lVar62 + lVar29 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 4) =
                             *(undefined4 *)(lVar48 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 8) =
                             *(undefined4 *)(lVar60 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0xc) =
                             *(undefined4 *)(lVar22 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x10) =
                             *(undefined4 *)(lVar21 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x14) =
                             *(undefined4 *)(lVar51 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x18) =
                             *(undefined4 *)(local_248._0_8_ + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x1c) =
                             *(undefined4 *)(lVar37 + lVar62 + lVar11 + lVar74);
                        lVar83 = lVar83 + 0x20;
                        lVar74 = lVar74 + lVar41;
                      } while ((int)lVar83 != 0x100);
                      uVar28 = uVar28 + 1;
                      lVar70 = lVar70 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar83);
                    } while (uVar28 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar83);
                  }
                  uVar28 = uVar77 + 8;
                  lVar70 = uVar77 + 0xf;
                  lVar67 = lVar67 + local_160 * 0x20;
                  uVar77 = uVar28;
                } while (lVar70 < lVar27);
              }
              if ((int)((uint)uVar28 | 3) < (int)num_input) {
                lVar62 = lVar41 * (uVar28 & 0xffffffff);
                lVar67 = 0;
                uVar77 = uVar28 & 0xffffffff;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar70 = lVar67;
                    do {
                      puVar33 = puVar68;
                      lVar83 = 0;
                      lVar74 = lVar70;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar83) =
                             *(undefined4 *)(lVar62 + lVar29 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 4) =
                             *(undefined4 *)(lVar48 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 8) =
                             *(undefined4 *)(lVar60 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0xc) =
                             *(undefined4 *)(lVar22 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x10) =
                             *(undefined4 *)(lVar21 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x14) =
                             *(undefined4 *)(lVar51 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x18) =
                             *(undefined4 *)(local_248._0_8_ + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x1c) =
                             *(undefined4 *)(lVar37 + lVar62 + lVar11 + lVar74);
                        lVar83 = lVar83 + 0x20;
                        lVar74 = lVar74 + lVar41;
                      } while ((int)lVar83 != 0x80);
                      uVar28 = uVar28 + 1;
                      lVar70 = lVar70 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar83);
                    } while (uVar28 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar83);
                  }
                  uVar28 = uVar77 + 4;
                  lVar70 = uVar77 + 7;
                  lVar67 = lVar67 + local_160 * 0x10;
                  uVar77 = uVar28;
                } while (lVar70 < lVar27);
              }
              uVar79 = (uint)uVar28;
              if ((int)(uVar79 | 1) < (int)num_input) {
                lVar62 = lVar41 * (int)uVar79;
                lVar67 = 0;
                uVar77 = (long)(int)uVar79;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar70 = lVar67;
                    do {
                      puVar33 = puVar68;
                      lVar83 = 0;
                      lVar74 = lVar70;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar83) =
                             *(undefined4 *)(lVar62 + lVar29 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 4) =
                             *(undefined4 *)(lVar48 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 8) =
                             *(undefined4 *)(lVar60 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0xc) =
                             *(undefined4 *)(lVar22 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x10) =
                             *(undefined4 *)(lVar21 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x14) =
                             *(undefined4 *)(lVar51 + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x18) =
                             *(undefined4 *)(local_248._0_8_ + lVar62 + lVar11 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar83 + 0x1c) =
                             *(undefined4 *)(lVar37 + lVar62 + lVar11 + lVar74);
                        lVar83 = lVar83 + 0x20;
                        lVar74 = lVar74 + lVar41;
                      } while ((int)lVar83 == 0x20);
                      uVar28 = uVar28 + 1;
                      lVar70 = lVar70 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar83);
                    } while (uVar28 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar83);
                  }
                  uVar28 = uVar77 + 2;
                  lVar70 = uVar77 + 3;
                  lVar67 = lVar67 + local_160 * 8;
                  uVar77 = uVar28;
                } while (lVar70 < lVar27);
              }
              if ((int)uVar28 < (int)num_input) {
                lVar62 = (long)(int)uVar28;
                lVar67 = lVar41 * lVar62;
                lVar70 = lVar37 + lVar67 + lVar11;
                lVar37 = local_248._0_8_ + lVar67 + lVar11;
                lVar51 = lVar51 + lVar67 + lVar11;
                lVar21 = lVar21 + lVar67 + lVar11;
                lVar22 = lVar22 + lVar67 + lVar11;
                lVar60 = lVar60 + lVar67 + lVar11;
                lVar48 = lVar48 + lVar67 + lVar11;
                lVar29 = lVar67 + lVar29 + lVar11;
                do {
                  if (0 < (int)uVar73) {
                    lVar67 = 0;
                    puVar33 = puVar68;
                    do {
                      puVar56 = puVar33;
                      puVar33 = puVar68 + lVar67 * 2;
                      *puVar33 = *(undefined4 *)(lVar29 + lVar67);
                      puVar33[1] = *(undefined4 *)(lVar48 + lVar67);
                      puVar33[2] = *(undefined4 *)(lVar60 + lVar67);
                      puVar33[3] = *(undefined4 *)(lVar22 + lVar67);
                      puVar33[4] = *(undefined4 *)(lVar21 + lVar67);
                      puVar33[5] = *(undefined4 *)(lVar51 + lVar67);
                      puVar33[6] = *(undefined4 *)(lVar37 + lVar67);
                      puVar33[7] = *(undefined4 *)(lVar70 + lVar67);
                      lVar67 = lVar67 + 4;
                      puVar33 = puVar33 + 8;
                    } while (uVar35 * 4 != lVar67);
                    puVar68 = puVar56 + 8;
                  }
                  lVar62 = lVar62 + 1;
                  lVar70 = lVar70 + lVar41;
                  lVar37 = lVar37 + lVar41;
                  lVar51 = lVar51 + lVar41;
                  lVar21 = lVar21 + lVar41;
                  lVar22 = lVar22 + lVar41;
                  lVar60 = lVar60 + lVar41;
                  lVar48 = lVar48 + lVar41;
                  lVar29 = lVar29 + lVar41;
                } while (lVar62 != lVar27);
              }
              uVar28 = uVar49 + 8;
              lVar29 = uVar49 + 0xf;
              iVar34 = iVar34 + iVar72;
              iVar44 = iVar44 + iVar72;
              iVar64 = iVar64 + iVar72;
              iVar69 = iVar69 + iVar72;
              iVar25 = iVar25 + iVar72;
              iVar17 = iVar17 + iVar72;
              iVar50 = iVar50 + iVar72;
              iVar59 = iVar59 + iVar72;
              uVar49 = uVar28;
            } while (lVar29 < (long)uVar47);
          }
          uVar79 = (uint)uVar28;
          if ((int)(uVar79 | 3) < (int)uVar30) {
            lVar11 = *(long *)(local_138 + 0x160);
            sVar9 = (this->weight_data_tm).elemsize;
            sVar10 = (this->weight_data_tm).cstep;
            pvVar7 = (this->weight_data_tm).data;
            iVar34 = uVar73 * num_input;
            iVar25 = (uVar79 | 3) * iVar34;
            iVar72 = iVar34 * 4;
            lVar29 = uVar35 * 0x40;
            local_248._0_8_ = lVar29;
            lVar41 = local_160 * 4;
            iVar59 = (uVar79 + 2) * iVar34;
            iVar17 = (uVar79 + 1) * iVar34;
            iVar34 = iVar34 * uVar79;
            uVar49 = uVar28 & 0xffffffff;
            do {
              puVar68 = (undefined4 *)
                        ((ulong)(((uint)(uVar49 >> 3) & 1) + ((uint)(uVar49 >> 4) & 0xfffffff) +
                                (uint)(((uint)uVar49 >> 2 & 1) != 0)) * sVar9 * sVar10 +
                        (long)pvVar7);
              if ((int)num_input < 0x10) {
                uVar28 = 0;
              }
              else {
                lVar22 = lVar11 + (long)iVar25 * 4;
                lVar21 = lVar11 + (long)iVar59 * 4;
                lVar51 = lVar11 + (long)iVar17 * 4;
                lVar48 = lVar11 + (long)iVar34 * 4;
                uVar77 = 0;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar37 = lVar48;
                    lVar60 = lVar21;
                    lVar62 = lVar51;
                    lVar67 = lVar22;
                    do {
                      puVar33 = puVar68;
                      lVar74 = 0;
                      lVar70 = 0;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar70) = *(undefined4 *)(lVar37 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar70 + 4) =
                             *(undefined4 *)(lVar62 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar70 + 8) =
                             *(undefined4 *)(lVar60 + lVar74);
                        *(undefined4 *)((long)puVar33 + lVar70 + 0xc) =
                             *(undefined4 *)(lVar67 + lVar74);
                        lVar70 = lVar70 + 0x10;
                        lVar74 = lVar74 + lVar41;
                      } while ((int)lVar70 != 0x100);
                      uVar28 = uVar28 + 1;
                      lVar67 = lVar67 + 4;
                      lVar60 = lVar60 + 4;
                      lVar62 = lVar62 + 4;
                      lVar37 = lVar37 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar70);
                    } while (uVar28 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar70);
                  }
                  uVar28 = uVar77 + 0x10;
                  lVar37 = uVar77 + 0x1f;
                  lVar22 = lVar22 + lVar29;
                  lVar21 = lVar21 + lVar29;
                  lVar51 = lVar51 + lVar29;
                  lVar48 = lVar48 + lVar29;
                  uVar77 = uVar28;
                } while (lVar37 < lVar27);
              }
              lVar48 = (long)iVar25 * 4;
              lVar51 = (long)iVar59 * 4;
              lVar22 = (long)iVar17 * 4;
              lVar21 = (long)iVar34 * 4;
              if ((int)((uint)uVar28 | 7) < (int)num_input) {
                lVar37 = lVar41 * (uVar28 & 0xffffffff);
                lVar60 = 0;
                uVar77 = uVar28 & 0xffffffff;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar62 = lVar60;
                    do {
                      puVar33 = puVar68;
                      lVar70 = 0;
                      lVar67 = lVar62;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar70) =
                             *(undefined4 *)(lVar37 + lVar21 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 4) =
                             *(undefined4 *)(lVar37 + lVar22 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 8) =
                             *(undefined4 *)(lVar37 + lVar51 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 0xc) =
                             *(undefined4 *)(lVar37 + lVar48 + lVar11 + lVar67);
                        lVar70 = lVar70 + 0x10;
                        lVar67 = lVar67 + lVar41;
                      } while ((int)lVar70 != 0x80);
                      uVar28 = uVar28 + 1;
                      lVar62 = lVar62 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar70);
                    } while (uVar28 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar70);
                  }
                  uVar28 = uVar77 + 8;
                  lVar62 = uVar77 + 0xf;
                  lVar60 = lVar60 + local_160 * 0x20;
                  uVar77 = uVar28;
                } while (lVar62 < lVar27);
              }
              if ((int)((uint)uVar28 | 3) < (int)num_input) {
                lVar37 = lVar41 * (uVar28 & 0xffffffff);
                lVar60 = 0;
                uVar77 = uVar28 & 0xffffffff;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar62 = lVar60;
                    do {
                      puVar33 = puVar68;
                      lVar70 = 0;
                      lVar67 = lVar62;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar70) =
                             *(undefined4 *)(lVar37 + lVar21 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 4) =
                             *(undefined4 *)(lVar37 + lVar22 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 8) =
                             *(undefined4 *)(lVar37 + lVar51 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 0xc) =
                             *(undefined4 *)(lVar37 + lVar48 + lVar11 + lVar67);
                        lVar70 = lVar70 + 0x10;
                        lVar67 = lVar67 + lVar41;
                      } while ((int)lVar70 != 0x40);
                      uVar28 = uVar28 + 1;
                      lVar62 = lVar62 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar70);
                    } while (uVar28 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar70);
                  }
                  uVar28 = uVar77 + 4;
                  lVar62 = uVar77 + 7;
                  lVar60 = lVar60 + local_160 * 0x10;
                  uVar77 = uVar28;
                } while (lVar62 < lVar27);
              }
              uVar79 = (uint)uVar28;
              if ((int)(uVar79 | 1) < (int)num_input) {
                lVar37 = lVar41 * (int)uVar79;
                lVar60 = 0;
                uVar77 = (long)(int)uVar79;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar62 = lVar60;
                    do {
                      puVar33 = puVar68;
                      lVar70 = 0;
                      lVar67 = lVar62;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar70) =
                             *(undefined4 *)(lVar37 + lVar21 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 4) =
                             *(undefined4 *)(lVar37 + lVar22 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 8) =
                             *(undefined4 *)(lVar37 + lVar51 + lVar11 + lVar67);
                        *(undefined4 *)((long)puVar33 + lVar70 + 0xc) =
                             *(undefined4 *)(lVar37 + lVar48 + lVar11 + lVar67);
                        lVar70 = lVar70 + 0x10;
                        lVar67 = lVar67 + lVar41;
                      } while ((int)lVar70 == 0x10);
                      uVar28 = uVar28 + 1;
                      lVar62 = lVar62 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar70);
                    } while (uVar28 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar70);
                  }
                  uVar28 = uVar77 + 2;
                  lVar62 = uVar77 + 3;
                  lVar60 = lVar60 + local_160 * 8;
                  uVar77 = uVar28;
                } while (lVar62 < lVar27);
              }
              if ((int)uVar28 < (int)num_input) {
                lVar37 = (long)(int)uVar28;
                lVar60 = lVar41 * lVar37;
                lVar48 = lVar48 + lVar60 + lVar11;
                lVar51 = lVar51 + lVar60 + lVar11;
                lVar22 = lVar22 + lVar60 + lVar11;
                lVar21 = lVar60 + lVar21 + lVar11;
                do {
                  if (0 < (int)uVar73) {
                    lVar60 = 0;
                    puVar33 = puVar68;
                    do {
                      puVar56 = puVar33;
                      puVar33 = puVar68 + lVar60;
                      *puVar33 = *(undefined4 *)(lVar21 + lVar60);
                      puVar33[1] = *(undefined4 *)(lVar22 + lVar60);
                      puVar33[2] = *(undefined4 *)(lVar51 + lVar60);
                      puVar33[3] = *(undefined4 *)(lVar48 + lVar60);
                      lVar60 = lVar60 + 4;
                      puVar33 = puVar33 + 4;
                    } while (uVar35 * 4 != lVar60);
                    puVar68 = puVar56 + 4;
                  }
                  lVar37 = lVar37 + 1;
                  lVar48 = lVar48 + lVar41;
                  lVar51 = lVar51 + lVar41;
                  lVar22 = lVar22 + lVar41;
                  lVar21 = lVar21 + lVar41;
                } while (lVar37 != lVar27);
              }
              uVar28 = uVar49 + 4;
              lVar22 = uVar49 + 7;
              iVar25 = iVar25 + iVar72;
              iVar59 = iVar59 + iVar72;
              iVar17 = iVar17 + iVar72;
              iVar34 = iVar34 + iVar72;
              uVar49 = uVar28;
            } while (lVar22 < (long)uVar47);
          }
          uVar79 = (uint)uVar28;
          if ((int)(uVar79 | 1) < (int)uVar30) {
            sVar9 = (this->weight_data_tm).elemsize;
            sVar10 = (this->weight_data_tm).cstep;
            local_248._0_8_ = (long)(int)(uVar73 * 8);
            iVar72 = uVar73 * num_input;
            iVar25 = (uVar79 | 1) * iVar72;
            local_13c = iVar72 * 2;
            uVar19 = iVar72 * uVar79;
            lVar83 = *(long *)(local_138 + 0x160);
            lVar41 = lVar83 + (long)(int)(uVar73 * 0xf) * 4;
            lVar38 = uVar35 * 0x40;
            lVar11 = lVar83 + (long)(int)(uVar73 * 0xe) * 4;
            lVar29 = lVar83 + (long)(int)(uVar73 * 0xd) * 4;
            lVar22 = lVar83 + (long)(int)(uVar73 * 0xc) * 4;
            lVar21 = lVar83 + (long)(int)(uVar73 * 0xb) * 4;
            lVar51 = lVar83 + (long)(int)(uVar73 * 10) * 4;
            lVar48 = lVar83 + (long)(int)(uVar73 * 9) * 4;
            lVar37 = lVar83 + (long)(int)(uVar73 * 8) * 4;
            lVar60 = lVar83 + (long)(int)(uVar73 * 7) * 4;
            local_158 = lVar83 + (long)(int)(uVar73 * 6) * 4;
            lVar62 = lVar83 + (long)(int)(uVar73 * 5) * 4;
            local_128 = lVar83 + (long)(int)(uVar73 * 4) * 4;
            lVar67 = lVar83 + (long)(int)(uVar73 * 3) * 4;
            local_228 = lVar83 + (long)(int)(uVar73 * 2) * 4;
            local_220 = local_160 * 0x20;
            lVar85 = local_160 * 0x10;
            pvVar7 = (this->weight_data_tm).data;
            local_118 = uVar35 * 4;
            lVar74 = local_160 * 4;
            lVar70 = lVar83 + local_160 * 4;
            local_130 = local_160 * 8;
            uVar28 = (long)(int)uVar79;
            do {
              local_120 = uVar28;
              local_150 = (ulong)uVar19;
              local_148 = CONCAT44(local_148._4_4_,iVar25);
              lVar43 = (long)iVar25;
              lVar39 = (long)(int)uVar19;
              puVar68 = (undefined4 *)
                        ((ulong)(((uint)(local_120 >> 2) & 1) +
                                 ((uint)(local_120 >> 4) & 0xfffffff) +
                                 (uint)(((uint)local_120 >> 3 & 1) != 0) +
                                (uint)(((uint)local_120 >> 1 & 1) != 0)) * sVar9 * sVar10 +
                        (long)pvVar7);
              if ((int)num_input < 0x10) {
                uVar28 = 0;
              }
              else {
                local_290 = lVar41 + lVar43 * 4;
                lVar42 = lVar11 + lVar43 * 4;
                lVar61 = lVar29 + lVar43 * 4;
                lVar75 = lVar22 + lVar43 * 4;
                lVar76 = lVar21 + lVar43 * 4;
                lVar87 = lVar51 + lVar43 * 4;
                lVar78 = lVar48 + lVar43 * 4;
                lVar71 = lVar37 + lVar43 * 4;
                lVar23 = lVar60 + lVar43 * 4;
                lVar86 = local_158 + lVar43 * 4;
                lVar53 = lVar62 + lVar43 * 4;
                local_248._0_8_ = lVar53;
                lVar66 = local_128 + lVar43 * 4;
                local_2e8 = lVar67 + lVar43 * 4;
                local_2e0 = local_228 + lVar43 * 4;
                local_2f0 = lVar70 + lVar43 * 4;
                local_2f8 = lVar83 + lVar43 * 4;
                local_2c0 = lVar41 + lVar39 * 4;
                local_2a0 = lVar11 + lVar39 * 4;
                local_250 = lVar29 + lVar39 * 4;
                local_100 = lVar22 + lVar39 * 4;
                local_108 = lVar21 + lVar39 * 4;
                local_110 = lVar51 + lVar39 * 4;
                lVar40 = lVar48 + lVar39 * 4;
                local_308 = lVar37 + lVar39 * 4;
                local_300 = lVar60 + lVar39 * 4;
                local_2a8 = local_158 + lVar39 * 4;
                local_2b0 = lVar62 + lVar39 * 4;
                local_270 = local_128 + lVar39 * 4;
                local_278 = lVar67 + lVar39 * 4;
                local_280 = local_228 + lVar39 * 4;
                local_288 = lVar70 + lVar39 * 4;
                lVar52 = lVar83 + lVar39 * 4;
                local_a0 = 0;
                do {
                  if (0 < (int)uVar73) {
                    lVar32 = 0;
                    do {
                      *puVar68 = *(undefined4 *)(lVar52 + lVar32);
                      puVar68[1] = *(undefined4 *)(local_288 + lVar32);
                      puVar68[2] = *(undefined4 *)(local_280 + lVar32);
                      puVar68[3] = *(undefined4 *)(local_278 + lVar32);
                      puVar68[4] = *(undefined4 *)(local_270 + lVar32);
                      puVar68[5] = *(undefined4 *)(local_2b0 + lVar32);
                      puVar68[6] = *(undefined4 *)(local_2a8 + lVar32);
                      puVar68[7] = *(undefined4 *)(local_300 + lVar32);
                      puVar68[8] = *(undefined4 *)(local_308 + lVar32);
                      puVar68[9] = *(undefined4 *)(lVar40 + lVar32);
                      puVar68[10] = *(undefined4 *)(local_110 + lVar32);
                      puVar68[0xb] = *(undefined4 *)(local_108 + lVar32);
                      puVar68[0xc] = *(undefined4 *)(local_100 + lVar32);
                      puVar68[0xd] = *(undefined4 *)(local_250 + lVar32);
                      puVar68[0xe] = *(undefined4 *)(local_2a0 + lVar32);
                      puVar68[0xf] = *(undefined4 *)(local_2c0 + lVar32);
                      puVar68[0x10] = *(undefined4 *)(local_2f8 + lVar32);
                      puVar68[0x11] = *(undefined4 *)(local_2f0 + lVar32);
                      puVar68[0x12] = *(undefined4 *)(local_2e0 + lVar32);
                      puVar68[0x13] = *(undefined4 *)(local_2e8 + lVar32);
                      puVar68[0x14] = *(undefined4 *)(lVar66 + lVar32);
                      puVar68[0x15] = *(undefined4 *)(lVar53 + lVar32);
                      puVar68[0x16] = *(undefined4 *)(lVar86 + lVar32);
                      puVar68[0x17] = *(undefined4 *)(lVar23 + lVar32);
                      puVar68[0x18] = *(undefined4 *)(lVar71 + lVar32);
                      puVar68[0x19] = *(undefined4 *)(lVar78 + lVar32);
                      puVar68[0x1a] = *(undefined4 *)(lVar87 + lVar32);
                      puVar68[0x1b] = *(undefined4 *)(lVar76 + lVar32);
                      puVar68[0x1c] = *(undefined4 *)(lVar75 + lVar32);
                      puVar68[0x1d] = *(undefined4 *)(lVar61 + lVar32);
                      puVar68[0x1e] = *(undefined4 *)(lVar42 + lVar32);
                      puVar68[0x1f] = *(undefined4 *)(local_290 + lVar32);
                      puVar68 = puVar68 + 0x20;
                      lVar32 = lVar32 + 4;
                    } while (local_118 != lVar32);
                  }
                  uVar28 = local_a0 + 0x10;
                  lVar32 = local_a0 + 0x1f;
                  local_290 = local_290 + lVar38;
                  lVar42 = lVar42 + lVar38;
                  lVar61 = lVar61 + lVar38;
                  lVar75 = lVar75 + lVar38;
                  lVar76 = lVar76 + lVar38;
                  lVar87 = lVar87 + lVar38;
                  lVar78 = lVar78 + lVar38;
                  lVar71 = lVar71 + lVar38;
                  lVar23 = lVar23 + lVar38;
                  lVar86 = lVar86 + lVar38;
                  lVar53 = lVar53 + lVar38;
                  local_248._0_8_ = lVar53;
                  lVar66 = lVar66 + lVar38;
                  local_2e8 = local_2e8 + lVar38;
                  local_2e0 = local_2e0 + lVar38;
                  local_2f0 = local_2f0 + lVar38;
                  local_2f8 = local_2f8 + lVar38;
                  local_2c0 = local_2c0 + lVar38;
                  local_2a0 = local_2a0 + lVar38;
                  local_250 = local_250 + lVar38;
                  local_100 = local_100 + lVar38;
                  local_108 = local_108 + lVar38;
                  local_110 = local_110 + lVar38;
                  lVar40 = lVar40 + lVar38;
                  local_308 = local_308 + lVar38;
                  local_300 = local_300 + lVar38;
                  local_2a8 = local_2a8 + lVar38;
                  local_2b0 = local_2b0 + lVar38;
                  local_270 = local_270 + lVar38;
                  local_278 = local_278 + lVar38;
                  local_280 = local_280 + lVar38;
                  local_288 = local_288 + lVar38;
                  lVar52 = lVar52 + lVar38;
                  local_a0 = uVar28;
                } while (lVar32 < lVar27);
              }
              lVar43 = lVar43 * 4;
              lVar39 = lVar39 * 4;
              if ((int)((uint)uVar28 | 7) < (int)num_input) {
                local_368 = uVar28 & 0xffffffff;
                lVar42 = lVar74 * local_368 + lVar43;
                local_390 = (undefined4 *)(lVar60 + lVar42);
                local_330 = local_158 + lVar42;
                local_310 = lVar62 + lVar42;
                local_360 = local_128 + lVar42;
                lVar61 = lVar67 + lVar42;
                local_378 = local_228 + lVar42;
                lVar23 = (local_368 * 4 + 4) * local_160;
                local_370 = lVar43 + lVar83 + lVar23;
                lVar53 = lVar74 * local_368 + lVar39;
                lVar86 = lVar60 + lVar53;
                lVar75 = local_158 + lVar53;
                lVar76 = lVar62 + lVar53;
                lVar23 = lVar23 + lVar83 + lVar39;
                lVar87 = lVar53 + local_128;
                lVar78 = lVar67 + lVar53;
                lVar71 = local_228 + lVar53;
                do {
                  local_248._0_8_ = lVar76;
                  if (0 < (int)uVar73) {
                    lVar66 = 0;
                    do {
                      *puVar68 = *(undefined4 *)(lVar83 + lVar53 + lVar66);
                      puVar68[1] = *(undefined4 *)(lVar23 + lVar66);
                      puVar68[2] = *(undefined4 *)(lVar71 + lVar66);
                      puVar68[3] = *(undefined4 *)(lVar78 + lVar66);
                      puVar68[4] = *(undefined4 *)(lVar87 + lVar66);
                      puVar68[5] = *(undefined4 *)(lVar76 + lVar66);
                      puVar68[6] = *(undefined4 *)(lVar75 + lVar66);
                      puVar68[7] = *(undefined4 *)(lVar86 + lVar66);
                      puVar68[8] = *(undefined4 *)(lVar83 + lVar42 + lVar66);
                      puVar68[9] = *(undefined4 *)(local_370 + lVar66);
                      puVar68[10] = *(undefined4 *)(local_378 + lVar66);
                      puVar68[0xb] = *(undefined4 *)(lVar61 + lVar66);
                      puVar68[0xc] = *(undefined4 *)(local_360 + lVar66);
                      puVar68[0xd] = *(undefined4 *)(local_310 + lVar66);
                      puVar68[0xe] = *(undefined4 *)(local_330 + lVar66);
                      puVar68[0xf] = *(undefined4 *)((long)local_390 + lVar66);
                      puVar68 = puVar68 + 0x10;
                      lVar66 = lVar66 + 4;
                    } while (local_118 != lVar66);
                  }
                  uVar28 = local_368 + 8;
                  lVar66 = local_368 + 0xf;
                  local_390 = (undefined4 *)((long)local_390 + local_220);
                  local_330 = local_330 + local_220;
                  local_310 = local_310 + local_220;
                  local_360 = local_360 + local_220;
                  lVar61 = lVar61 + local_220;
                  local_378 = local_378 + local_220;
                  local_370 = local_370 + local_220;
                  lVar42 = lVar42 + local_220;
                  lVar86 = lVar86 + local_220;
                  lVar75 = lVar75 + local_220;
                  lVar76 = lVar76 + local_220;
                  lVar87 = lVar87 + local_220;
                  lVar78 = lVar78 + local_220;
                  lVar71 = lVar71 + local_220;
                  lVar23 = lVar23 + local_220;
                  lVar53 = lVar53 + local_220;
                  local_368 = uVar28;
                } while (lVar66 < lVar27);
              }
              if ((int)((uint)uVar28 | 3) < (int)num_input) {
                uVar49 = uVar28 & 0xffffffff;
                lVar42 = lVar74 * uVar49 + lVar43;
                lVar61 = lVar67 + lVar42;
                lVar75 = local_228 + lVar42;
                lVar71 = (uVar49 * 4 + 4) * local_160;
                lVar23 = lVar43 + lVar83 + lVar71;
                lVar42 = lVar42 + lVar83;
                lVar87 = lVar74 * uVar49 + lVar39;
                lVar78 = lVar67 + lVar87;
                lVar71 = lVar71 + lVar39 + lVar83;
                lVar76 = local_228 + lVar87;
                lVar87 = lVar87 + lVar83;
                do {
                  if (0 < (int)uVar73) {
                    lVar86 = 0;
                    puVar33 = puVar68;
                    do {
                      puVar56 = puVar33;
                      puVar33 = puVar68 + lVar86 * 2;
                      *puVar33 = *(undefined4 *)(lVar87 + lVar86);
                      puVar33[1] = *(undefined4 *)(lVar71 + lVar86);
                      puVar33[2] = *(undefined4 *)(lVar76 + lVar86);
                      puVar33[3] = *(undefined4 *)(lVar78 + lVar86);
                      puVar33[4] = *(undefined4 *)(lVar42 + lVar86);
                      puVar33[5] = *(undefined4 *)(lVar23 + lVar86);
                      puVar33[6] = *(undefined4 *)(lVar75 + lVar86);
                      puVar33[7] = *(undefined4 *)(lVar61 + lVar86);
                      lVar86 = lVar86 + 4;
                      puVar33 = puVar33 + 8;
                    } while (local_118 != lVar86);
                    puVar68 = puVar56 + 8;
                  }
                  uVar28 = uVar49 + 4;
                  lVar86 = uVar49 + 7;
                  lVar61 = lVar61 + lVar85;
                  lVar75 = lVar75 + lVar85;
                  lVar23 = lVar23 + lVar85;
                  lVar42 = lVar42 + lVar85;
                  lVar78 = lVar78 + lVar85;
                  lVar76 = lVar76 + lVar85;
                  lVar71 = lVar71 + lVar85;
                  lVar87 = lVar87 + lVar85;
                  uVar49 = uVar28;
                } while (lVar86 < lVar27);
              }
              uVar79 = (uint)uVar28;
              if ((int)(uVar79 | 1) < (int)num_input) {
                lVar42 = lVar74 * (int)uVar79;
                lVar61 = lVar42 + lVar43 + lVar83;
                lVar42 = lVar42 + lVar39 + lVar83;
                uVar49 = (long)(int)uVar79;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    lVar75 = lVar42;
                    lVar76 = lVar61;
                    do {
                      puVar33 = puVar68;
                      lVar78 = 0;
                      lVar87 = 0;
                      do {
                        *(undefined4 *)((long)puVar33 + lVar87) = *(undefined4 *)(lVar75 + lVar78);
                        *(undefined4 *)((long)puVar33 + lVar87 + 4) =
                             *(undefined4 *)(lVar76 + lVar78);
                        lVar87 = lVar87 + 8;
                        lVar78 = lVar78 + lVar74;
                      } while ((int)lVar87 == 8);
                      uVar28 = uVar28 + 1;
                      lVar76 = lVar76 + 4;
                      lVar75 = lVar75 + 4;
                      puVar68 = (undefined4 *)((long)puVar33 + lVar87);
                    } while (uVar28 != uVar35);
                    puVar68 = (undefined4 *)((long)puVar33 + lVar87);
                  }
                  uVar28 = uVar49 + 2;
                  lVar75 = uVar49 + 3;
                  lVar61 = lVar61 + local_130;
                  lVar42 = lVar42 + local_130;
                  uVar49 = uVar28;
                } while (lVar75 < lVar27);
              }
              if ((int)uVar28 < (int)num_input) {
                lVar42 = (long)(int)uVar28;
                lVar43 = lVar43 + lVar74 * lVar42 + lVar83;
                lVar39 = lVar74 * lVar42 + lVar39 + lVar83;
                do {
                  if (0 < (int)uVar73) {
                    uVar28 = 0;
                    do {
                      *puVar68 = *(undefined4 *)(lVar39 + uVar28 * 4);
                      puVar68[1] = *(undefined4 *)(lVar43 + uVar28 * 4);
                      puVar68 = puVar68 + 2;
                      uVar28 = uVar28 + 1;
                    } while (uVar35 != uVar28);
                  }
                  lVar42 = lVar42 + 1;
                  lVar43 = lVar43 + lVar74;
                  lVar39 = lVar39 + lVar74;
                } while (lVar42 != lVar27);
              }
              uVar28 = local_120 + 2;
              iVar25 = iVar25 + local_13c;
              uVar19 = uVar19 + local_13c;
            } while ((long)(local_120 + 3) < (long)uVar47);
          }
          iVar72 = (int)uVar28;
          if (iVar72 < (int)uVar30) {
            lVar11 = *(long *)(local_138 + 0x160);
            local_248._0_8_ = lVar11;
            pvVar7 = (this->weight_data_tm).data;
            sVar9 = (this->weight_data_tm).elemsize;
            sVar10 = (this->weight_data_tm).cstep;
            uVar28 = (ulong)iVar72;
            iVar72 = iVar72 * uVar73 * num_input;
            lVar41 = local_160 * 4;
            do {
              uVar30 = (uint)uVar28;
              pvVar54 = (void *)((ulong)((uVar30 & 1) + ((uint)(uVar28 >> 4) & 0xfffffff) +
                                         (uint)((uVar30 >> 3 & 1) != 0) + ((uint)(uVar28 >> 2) & 1)
                                        + (uint)((uVar30 >> 1 & 1) != 0)) * sVar9 * sVar10 +
                                (long)pvVar7);
              if ((int)num_input < 0x10) {
                uVar49 = 0;
              }
              else {
                puVar68 = (undefined4 *)(lVar11 + (long)iVar72 * 4);
                uVar77 = 0;
                do {
                  if (0 < (int)uVar73) {
                    uVar49 = 0;
                    puVar33 = puVar68;
                    do {
                      pvVar55 = pvVar54;
                      lVar29 = 0;
                      puVar56 = puVar33;
                      do {
                        *(undefined4 *)((long)pvVar55 + lVar29) = *puVar56;
                        lVar29 = lVar29 + 4;
                        puVar56 = puVar56 + local_160;
                      } while ((int)lVar29 != 0x40);
                      uVar49 = uVar49 + 1;
                      puVar33 = puVar33 + 1;
                      pvVar54 = (void *)(lVar29 + (long)pvVar55);
                    } while (uVar49 != uVar35);
                    pvVar54 = (void *)((long)pvVar55 + lVar29);
                  }
                  uVar49 = uVar77 + 0x10;
                  lVar29 = uVar77 + 0x1f;
                  puVar68 = puVar68 + uVar35 * 0x10;
                  uVar77 = uVar49;
                } while (lVar29 < lVar27);
              }
              lVar29 = (long)iVar72 * 4;
              if ((int)((uint)uVar49 | 7) < (int)num_input) {
                puVar68 = (undefined4 *)(lVar41 * (uVar49 & 0xffffffff) + lVar29 + lVar11);
                uVar77 = uVar49 & 0xffffffff;
                do {
                  if (0 < (int)uVar73) {
                    uVar49 = 0;
                    puVar33 = puVar68;
                    do {
                      pvVar55 = pvVar54;
                      lVar22 = 0;
                      puVar56 = puVar33;
                      do {
                        *(undefined4 *)((long)pvVar55 + lVar22) = *puVar56;
                        lVar22 = lVar22 + 4;
                        puVar56 = puVar56 + local_160;
                      } while ((int)lVar22 != 0x20);
                      uVar49 = uVar49 + 1;
                      puVar33 = puVar33 + 1;
                      pvVar54 = (void *)(lVar22 + (long)pvVar55);
                    } while (uVar49 != uVar35);
                    pvVar54 = (void *)((long)pvVar55 + lVar22);
                  }
                  uVar49 = uVar77 + 8;
                  lVar22 = uVar77 + 0xf;
                  puVar68 = puVar68 + local_160 * 8;
                  uVar77 = uVar49;
                } while (lVar22 < lVar27);
              }
              if ((int)((uint)uVar49 | 3) < (int)num_input) {
                puVar68 = (undefined4 *)(lVar41 * (uVar49 & 0xffffffff) + lVar29 + lVar11);
                uVar77 = uVar49 & 0xffffffff;
                do {
                  if (0 < (int)uVar73) {
                    uVar49 = 0;
                    puVar33 = puVar68;
                    do {
                      pvVar55 = pvVar54;
                      lVar22 = 0;
                      puVar56 = puVar33;
                      do {
                        *(undefined4 *)((long)pvVar55 + lVar22) = *puVar56;
                        lVar22 = lVar22 + 4;
                        puVar56 = puVar56 + local_160;
                      } while ((int)lVar22 != 0x10);
                      uVar49 = uVar49 + 1;
                      puVar33 = puVar33 + 1;
                      pvVar54 = (void *)(lVar22 + (long)pvVar55);
                    } while (uVar49 != uVar35);
                    pvVar54 = (void *)((long)pvVar55 + lVar22);
                  }
                  uVar49 = uVar77 + 4;
                  lVar22 = uVar77 + 7;
                  puVar68 = puVar68 + local_160 * 4;
                  uVar77 = uVar49;
                } while (lVar22 < lVar27);
              }
              uVar30 = (uint)uVar49;
              if ((int)(uVar30 | 1) < (int)num_input) {
                puVar68 = (undefined4 *)(lVar41 * (int)uVar30 + lVar29 + lVar11);
                uVar77 = (long)(int)uVar30;
                do {
                  if (0 < (int)uVar73) {
                    uVar49 = 0;
                    puVar33 = puVar68;
                    do {
                      pvVar55 = pvVar54;
                      lVar22 = 0;
                      puVar56 = puVar33;
                      do {
                        *(undefined4 *)((long)pvVar55 + lVar22) = *puVar56;
                        lVar22 = lVar22 + 4;
                        puVar56 = puVar56 + local_160;
                      } while ((int)lVar22 == 4);
                      uVar49 = uVar49 + 1;
                      puVar33 = puVar33 + 1;
                      pvVar54 = (void *)(lVar22 + (long)pvVar55);
                    } while (uVar49 != uVar35);
                    pvVar54 = (void *)((long)pvVar55 + lVar22);
                  }
                  uVar49 = uVar77 + 2;
                  lVar22 = uVar77 + 3;
                  puVar68 = puVar68 + local_160 * 2;
                  uVar77 = uVar49;
                } while (lVar22 < lVar27);
              }
              if ((int)uVar49 < (int)num_input) {
                lVar22 = (long)(int)uVar49;
                lVar29 = lVar41 * lVar22 + lVar29 + lVar11;
                do {
                  if (0 < (int)uVar73) {
                    lVar21 = 0;
                    do {
                      *(undefined4 *)((long)pvVar54 + lVar21) = *(undefined4 *)(lVar29 + lVar21);
                      lVar21 = lVar21 + 4;
                    } while (uVar35 * 4 - lVar21 != 0);
                    pvVar54 = (void *)((long)pvVar54 + lVar21);
                  }
                  lVar22 = lVar22 + 1;
                  lVar29 = lVar29 + lVar41;
                } while (lVar22 != lVar27);
              }
              uVar28 = uVar28 + 1;
              iVar72 = iVar72 + uVar73 * num_input;
            } while (uVar28 != uVar47);
          }
          goto LAB_001cfe90;
        }
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)(local_138 + 0x160),&this->weight_data_tm,num_input,uVar30,iVar59,iVar72,
                 (int)local_398,uVar79);
    }
LAB_001cfe90:
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var6 = this->_vptr_Convolution_x86_avx512[-3];
    p_Var36 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx512 + (long)p_Var6);
    pauVar82 = (undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var6);
    piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var6);
    if (piVar4 == (int *)0x0) goto LAB_001cfef2;
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) goto LAB_001cfef2;
    pvVar7 = *(void **)(p_Var36 + 0x160);
    plVar8 = *(long **)(p_Var36 + 0x180);
  }
  if (plVar8 == (long *)0x0) {
    if (pvVar7 != (void *)0x0) {
      free(pvVar7);
    }
  }
  else {
    (**(code **)(*plVar8 + 0x18))();
  }
LAB_001cfef2:
  *(undefined8 *)(p_Var36 + 0x1a0) = 0;
  *(undefined1 (*) [16])(*pauVar82 + 0xc) = (undefined1  [16])0x0;
  *pauVar82 = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(p_Var36 + 0x188) = (undefined1  [16])0x0;
  *(undefined4 *)(p_Var36 + 0x198) = 0;
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}